

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int whereClauseInsert(WhereClause *pWC,Expr *p,u8 wtFlags)

{
  sqlite3 *db;
  undefined1 auVar1 [16];
  uint uVar2;
  int iVar3;
  WhereTerm *__dest;
  WhereTerm *pWVar4;
  
  iVar3 = pWC->nTerm;
  if (pWC->nSlot <= iVar3) {
    pWVar4 = pWC->a;
    db = pWC->pParse->db;
    __dest = (WhereTerm *)sqlite3DbMallocRaw(db,pWC->nSlot * 0x70);
    pWC->a = __dest;
    if (__dest == (WhereTerm *)0x0) {
      if ((wtFlags & 1) != 0) {
        sqlite3ExprDelete(db,p);
      }
      pWC->a = pWVar4;
      return 0;
    }
    memcpy(__dest,pWVar4,(long)pWC->nTerm * 0x38);
    if (pWVar4 != pWC->aStatic) {
      sqlite3DbFree(db,pWVar4);
    }
    pWVar4 = pWC->a;
    if (((pWVar4 == (WhereTerm *)0x0 || db == (sqlite3 *)0x0) ||
        (pWVar4 < (WhereTerm *)(db->lookaside).pStart)) ||
       ((WhereTerm *)(db->lookaside).pEnd <= pWVar4)) {
      uVar2 = (*sqlite3Config.m.xSize)(pWVar4);
    }
    else {
      uVar2 = (uint)(db->lookaside).sz;
    }
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (ulong)(long)(int)uVar2 >> 3;
    pWC->nSlot = SUB164(auVar1 * ZEXT816(0x2492492492492493),8);
    iVar3 = pWC->nTerm;
  }
  pWC->nTerm = iVar3 + 1;
  pWVar4 = pWC->a + iVar3;
  for (; p != (Expr *)0x0; p = p->pLeft) {
    if ((p->op != '\\') && (p->op != '\x18')) goto LAB_001969db;
  }
  p = (Expr *)0x0;
LAB_001969db:
  pWVar4->pExpr = p;
  pWVar4->wtFlags = wtFlags;
  pWVar4->pWC = pWC;
  pWVar4->iParent = -1;
  return iVar3;
}

Assistant:

static int whereClauseInsert(WhereClause *pWC, Expr *p, u8 wtFlags){
  WhereTerm *pTerm;
  int idx;
  testcase( wtFlags & TERM_VIRTUAL );  /* EV: R-00211-15100 */
  if( pWC->nTerm>=pWC->nSlot ){
    WhereTerm *pOld = pWC->a;
    sqlite3 *db = pWC->pParse->db;
    pWC->a = sqlite3DbMallocRaw(db, sizeof(pWC->a[0])*pWC->nSlot*2 );
    if( pWC->a==0 ){
      if( wtFlags & TERM_DYNAMIC ){
        sqlite3ExprDelete(db, p);
      }
      pWC->a = pOld;
      return 0;
    }
    memcpy(pWC->a, pOld, sizeof(pWC->a[0])*pWC->nTerm);
    if( pOld!=pWC->aStatic ){
      sqlite3DbFree(db, pOld);
    }
    pWC->nSlot = sqlite3DbMallocSize(db, pWC->a)/sizeof(pWC->a[0]);
  }
  pTerm = &pWC->a[idx = pWC->nTerm++];
  pTerm->pExpr = sqlite3ExprSkipCollate(p);
  pTerm->wtFlags = wtFlags;
  pTerm->pWC = pWC;
  pTerm->iParent = -1;
  return idx;
}